

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellUtilityTest.cpp
# Opt level: O2

string * anon_unknown.dwarf_48104::quoted(string *__return_storage_ptr__,string *s)

{
  string quote;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,"\'",(allocator *)&local_60);
  std::operator+(&local_60,&local_40,s);
  std::operator+(__return_storage_ptr__,&local_60,&local_40);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string quoted(std::string s) {
#if defined(_WIN32)
  std::string quote = "\"";
#else
  std::string quote = "'";
#endif
  return quote + s + quote;
}